

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::Result(JunitReporter *this,AssertionResult *assertionResult)

{
  byte bVar1;
  OfType OVar2;
  int iVar3;
  IConfig *pIVar4;
  ostream *poVar5;
  AssertionResult *in_RSI;
  long in_RDI;
  ostringstream oss;
  TestStats stats;
  TestCaseStats *testCaseStats;
  AssertionResult *in_stack_fffffffffffffcb8;
  string *this_00;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  value_type *__x;
  string *this_01;
  byte local_2f9;
  string local_2f8 [32];
  undefined1 local_2d8 [136];
  string local_250 [32];
  ostringstream local_230 [376];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  reference local_38;
  byte local_19;
  Ptr<Catch::IConfig> local_18;
  AssertionResult *local_10;
  
  local_10 = in_RSI;
  OVar2 = AssertionResult::getResultType(in_RSI);
  local_19 = 0;
  local_2f9 = 1;
  if (OVar2 == Ok) {
    ReporterConfig::fullConfig((ReporterConfig *)in_stack_fffffffffffffcb8);
    local_19 = 1;
    pIVar4 = Ptr<Catch::IConfig>::operator->(&local_18);
    iVar3 = (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[7])();
    local_2f9 = (byte)iVar3;
  }
  if ((local_19 & 1) != 0) {
    Ptr<Catch::IConfig>::~Ptr
              ((Ptr<Catch::IConfig> *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0))
    ;
  }
  if ((local_2f9 & 1) == 0) {
    return;
  }
  local_38 = std::
             vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
             ::back((vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
                     *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  TestStats::TestStats((TestStats *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  std::__cxx11::ostringstream::ostringstream(local_230);
  AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffcb8);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_250);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffcb8);
    poVar5 = std::operator<<((ostream *)local_230,(string *)(local_2d8 + 0x68));
    std::operator<<(poVar5," at ");
    std::__cxx11::string::~string((string *)(local_2d8 + 0x68));
  }
  AssertionResult::getSourceInfo(in_stack_fffffffffffffcb8);
  operator<<((ostream *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (SourceLineInfo *)in_stack_fffffffffffffcb8);
  SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x1865b7);
  std::__cxx11::ostringstream::str();
  this_01 = (string *)(local_2d8 + 0x20);
  std::__cxx11::string::operator=(local_58,this_01);
  std::__cxx11::string::~string(this_01);
  AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_fffffffffffffcb8);
  __x = (value_type *)local_2d8;
  std::__cxx11::string::operator=(local_78,(string *)__x);
  std::__cxx11::string::~string((string *)__x);
  AssertionResult::getTestMacroName_abi_cxx11_(in_stack_fffffffffffffcb8);
  this_00 = local_2f8;
  std::__cxx11::string::operator=(local_98,this_00);
  std::__cxx11::string::~string(this_00);
  OVar2 = AssertionResult::getResultType(local_10);
  if (OVar2 != Unknown) {
    if (OVar2 == Ok) {
      std::__cxx11::string::operator=(local_b8,"success");
      goto LAB_00186855;
    }
    if (OVar2 == Info) {
      std::__cxx11::string::operator=(local_b8,"info");
      goto LAB_00186855;
    }
    if (OVar2 == Warning) {
      std::__cxx11::string::operator=(local_b8,"warning");
      goto LAB_00186855;
    }
    if (OVar2 != FailureBit) {
      if (OVar2 == ExpressionFailed) {
        std::__cxx11::string::operator=(local_b8,"failure");
        *(long *)(*(long *)(in_RDI + 0x80) + 8) = *(long *)(*(long *)(in_RDI + 0x80) + 8) + 1;
        goto LAB_00186855;
      }
      if (OVar2 == ExplicitFailure) {
        std::__cxx11::string::operator=(local_b8,"failure");
        *(long *)(*(long *)(in_RDI + 0x80) + 8) = *(long *)(*(long *)(in_RDI + 0x80) + 8) + 1;
        goto LAB_00186855;
      }
      if (OVar2 != Exception) {
        if (OVar2 == ThrewException) {
          std::__cxx11::string::operator=(local_b8,"error");
          *(long *)(*(long *)(in_RDI + 0x80) + 0x18) =
               *(long *)(*(long *)(in_RDI + 0x80) + 0x18) + 1;
        }
        else if (OVar2 == DidntThrowException) {
          std::__cxx11::string::operator=(local_b8,"failure");
          *(long *)(*(long *)(in_RDI + 0x80) + 8) = *(long *)(*(long *)(in_RDI + 0x80) + 8) + 1;
        }
        goto LAB_00186855;
      }
    }
  }
  std::__cxx11::string::operator=(local_b8,"* internal error *");
LAB_00186855:
  std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>::
  push_back((vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>
             *)this_01,__x);
  std::__cxx11::ostringstream::~ostringstream(local_230);
  TestStats::~TestStats((TestStats *)CONCAT44(OVar2,in_stack_fffffffffffffcc0));
  return;
}

Assistant:

virtual void Result( const Catch::AssertionResult& assertionResult ) {
            if( assertionResult.getResultType() != ResultWas::Ok || m_config.fullConfig()->includeSuccessfulResults() ) {
                TestCaseStats& testCaseStats = m_currentStats->m_testCaseStats.back();
                TestStats stats;
                std::ostringstream oss;
                if( !assertionResult.getMessage().empty() )
                    oss << assertionResult.getMessage() << " at ";
                oss << assertionResult.getSourceInfo();
                stats.m_content = oss.str();
                stats.m_message = assertionResult.getExpandedExpression();
                stats.m_resultType = assertionResult.getTestMacroName();

                switch( assertionResult.getResultType() ) {
                    case ResultWas::ThrewException:
                        stats.m_element = "error";
                        m_currentStats->m_errorsCount++;
                        break;
                    case ResultWas::Info:
                        stats.m_element = "info"; // !TBD ?
                        break;
                    case ResultWas::Warning:
                        stats.m_element = "warning"; // !TBD ?
                        break;
                    case ResultWas::ExplicitFailure:
                        stats.m_element = "failure";
                        m_currentStats->m_failuresCount++;
                        break;
                    case ResultWas::ExpressionFailed:
                        stats.m_element = "failure";
                        m_currentStats->m_failuresCount++;
                        break;
                    case ResultWas::Ok:
                        stats.m_element = "success";
                        break;
                    case ResultWas::DidntThrowException:
                        stats.m_element = "failure";
                        m_currentStats->m_failuresCount++;
                        break;
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        stats.m_element = "* internal error *";
                        break;
                }
                testCaseStats.m_testStats.push_back( stats );
            }
        }